

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O2

bool pstore::index::details::internal_node::validate_after_load
               (internal_node *internal,typed_address<pstore::index::details::internal_node> addr)

{
  bool bVar1;
  uint uVar2;
  index_pointer *piVar3;
  index_pointer *__it;
  long lVar4;
  index_pointer *__it_00;
  index_pointer *piVar5;
  ulong uVar6;
  address local_38;
  
  bVar1 = std::operator!=(&internal->signature_,(array<unsigned_char,_8UL> *)&node_signature_);
  if (bVar1) {
    return false;
  }
  uVar2 = size(internal);
  piVar3 = internal->children_ + uVar2;
  __it = internal[1].children_;
  lVar4 = (ulong)uVar2 << 3;
  local_38 = addr.a_.a_;
  for (uVar6 = (ulong)(uVar2 >> 2); __it_00 = __it + -3, piVar5 = __it_00, 0 < (long)uVar6;
      uVar6 = uVar6 - 1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::$_0>
            ::operator()((_Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::__0>
                          *)&local_38,__it_00);
    if (bVar1) goto LAB_00118e34;
    bVar1 = __gnu_cxx::__ops::
            _Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::$_0>
            ::operator()((_Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::__0>
                          *)&local_38,__it + -2);
    piVar5 = __it + -2;
    if (bVar1) goto LAB_00118e34;
    bVar1 = __gnu_cxx::__ops::
            _Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::$_0>
            ::operator()((_Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::__0>
                          *)&local_38,__it + -1);
    piVar5 = __it + -1;
    if ((bVar1) ||
       (bVar1 = __gnu_cxx::__ops::
                _Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::$_0>
                ::operator()((_Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::__0>
                              *)&local_38,__it), piVar5 = __it, bVar1)) goto LAB_00118e34;
    __it = __it + 4;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 != 1) {
    if (lVar4 == 3) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::$_0>
              ::operator()((_Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::__0>
                            *)&local_38,__it_00);
      if (bVar1) goto LAB_00118e34;
      __it_00 = __it + -2;
    }
    else {
      piVar5 = piVar3;
      if (lVar4 != 2) goto LAB_00118e34;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::$_0>
            ::operator()((_Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::__0>
                          *)&local_38,__it_00);
    piVar5 = __it_00;
    if (bVar1) goto LAB_00118e34;
    __it_00 = __it_00 + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::$_0>
          ::operator()((_Iter_negate<pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::__0>
                        *)&local_38,__it_00);
  piVar5 = __it_00;
  if (!bVar1) {
    piVar5 = piVar3;
  }
LAB_00118e34:
  return piVar5 == piVar3;
}

Assistant:

bool internal_node::validate_after_load (internal_node const & internal,
                                                     typed_address<internal_node> const addr) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (internal.signature_ != node_signature_) {
                    return false;
                }
#endif
                return std::all_of (std::begin (internal), std::end (internal),
                                    [addr] (index_pointer const & child) {
                                        if (child.is_heap () ||
                                            child.untag_address<internal_node> () >= addr) {
                                            return false;
                                        }
                                        return true;
                                    });
            }